

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# okim6258.c
# Opt level: O1

void okim6258_update(void *param,UINT32 samples,DEV_SMPL **outputs)

{
  byte bVar1;
  ushort uVar2;
  ushort uVar3;
  DEV_SMPL *pDVar4;
  DEV_SMPL *pDVar5;
  byte bVar6;
  byte bVar7;
  undefined2 uVar8;
  uint uVar9;
  int iVar10;
  byte bVar11;
  byte bVar12;
  DEV_SMPL DVar13;
  ulong uVar14;
  byte bVar15;
  uint uVar16;
  short sVar17;
  
  pDVar4 = *outputs;
  pDVar5 = outputs[1];
  if (((*(byte *)((long)param + 8) & 2) == 0) || (*(char *)((long)param + 0x38) != '\0')) {
    if (samples != 0) {
      uVar14 = 0;
      do {
        pDVar4[uVar14] = 0;
        pDVar5[uVar14] = 0;
        uVar14 = uVar14 + 1;
      } while (samples != uVar14);
    }
  }
  else {
    bVar7 = *(byte *)((long)param + 0x17);
    if (samples != 0) {
      uVar2 = *(ushort *)((long)param + 0x1a);
      bVar1 = *(byte *)((long)param + 0x2b);
      bVar15 = *(byte *)((long)param + 0x2a);
      uVar14 = 0;
      do {
        if (bVar7 == 0) {
          if (bVar15 == 0) {
            bVar11 = *(byte *)((long)param + 0x29) + 0x10;
            *(undefined1 *)((long)param + 0x16) =
                 *(undefined1 *)((long)param + (ulong)(*(byte *)((long)param + 0x29) >> 4) + 0x20);
            bVar12 = bVar11 & 0x7f;
            *(byte *)((long)param + 0x29) = bVar12;
            bVar6 = 1;
            if (bVar12 >> 4 == (bVar11 & 0xf)) goto LAB_00163fdc;
          }
          else if (-1 < (char)bVar15) {
            bVar6 = bVar15 + 1;
LAB_00163fdc:
            bVar15 = bVar6;
            *(byte *)((long)param + 0x2a) = bVar15;
          }
        }
        if (bVar15 < 2) {
          uVar16 = (uint)(*(byte *)((long)param + 0x16) >> (bVar7 & 0x1f));
          sVar17 = (short)((uint)(*(short *)((long)param + 0x1c) * 0xf5) >> 8) +
                   (short)diff_lookup
                          [(int)((int)*(short *)((long)param + 0x1e) << 4 | uVar16 & 0xf)];
          *(short *)((long)param + 0x1c) = sVar17;
          uVar8 = 0x7ff;
          if ((0x7ff < sVar17) || (uVar8 = 0xf800, sVar17 < -0x800)) {
            *(undefined2 *)((long)param + 0x1c) = uVar8;
          }
          sVar17 = *(short *)((long)param + 0x1e) + (short)index_shift[uVar16 & 7];
          *(short *)((long)param + 0x1e) = sVar17;
          uVar8 = 0x30;
          if (sVar17 < 0x31) {
            if (sVar17 < 0) {
              uVar8 = 0;
              goto LAB_0016406f;
            }
          }
          else {
LAB_0016406f:
            *(undefined2 *)((long)param + 0x1e) = uVar8;
          }
          uVar3 = *(ushort *)((long)param + 0x1c);
          *(ushort *)((long)param + 0x2c) = uVar3;
        }
        else {
          if (bVar15 != 2) {
            bVar15 = bVar15 - 1;
            *(byte *)((long)param + 0x2a) = bVar15;
            uVar16 = *(short *)((long)param + 0x1c) * 0xf;
            uVar9 = *(short *)((long)param + 0x1c) * 0xf + 0xf;
            if (-1 < (int)uVar16) {
              uVar9 = uVar16;
            }
            uVar8 = (undefined2)(uVar9 >> 4);
            *(undefined2 *)((long)param + 0x1c) = uVar8;
            *(undefined2 *)((long)param + 0x2c) = uVar8;
          }
          uVar3 = *(ushort *)((long)param + 0x2c);
        }
        bVar7 = bVar7 ^ 4;
        iVar10 = (int)(short)((uVar3 & uVar2) << 4);
        DVar13 = 0;
        if ((bVar1 & 2) == 0) {
          DVar13 = iVar10;
        }
        if ((bVar1 & 1) != 0) {
          iVar10 = 0;
        }
        pDVar4[uVar14] = DVar13;
        pDVar5[uVar14] = iVar10;
        uVar14 = uVar14 + 1;
      } while (samples != uVar14);
    }
    *(byte *)((long)param + 0x17) = bVar7;
  }
  return;
}

Assistant:

static void okim6258_update(void *param, UINT32 samples, DEV_SMPL **outputs)
{
	okim6258_state *chip = (okim6258_state *)param;
	DEV_SMPL *bufL = outputs[0];
	DEV_SMPL *bufR = outputs[1];
	UINT32 i;

	if ((chip->status & STATUS_PLAYING) && ! chip->Muted)
	{
		UINT8 nibble_shift = chip->nibble_shift;

		for (i = 0; i < samples; i++)
		{
			/* Compute the new amplitude and update the current step */
			int nibble;
			INT16 sample;
			
			if (! nibble_shift)
			{
				// 1st nibble - get data
				if (! chip->data_empty)
				{
					chip->data_in = chip->data_buf[chip->data_buf_pos >> 4];
					chip->data_buf_pos += 0x10;
					chip->data_buf_pos &= 0x7F;
					if ((chip->data_buf_pos >> 4) == (chip->data_buf_pos & 0x0F))
						chip->data_empty ++;
				}
				else
				{
					//chip->data_in = chip->data_in_last;
					if (chip->data_empty < 0x80)
						chip->data_empty ++;
				}
			}
			nibble = (chip->data_in >> nibble_shift) & 0xf;

			/* Output to the buffer */
			//sample = clock_adpcm(chip, nibble);
			if (chip->data_empty < 0x02)
			{
				sample = clock_adpcm(chip, nibble);
				chip->last_smpl = sample;
			}
			else
			{
				// Valley Bell: data_empty behaviour (loosely) ported from XM6
				if (chip->data_empty >= 0x02 + 0x01)
				{
					chip->data_empty -= 0x01;
					chip->signal = chip->signal * 15 / 16;
					chip->last_smpl = chip->signal;
				}
				sample = chip->last_smpl;
			}

			nibble_shift ^= 4;

			sample &= chip->output_mask;	// emulate DAC precision
			sample <<= 4;	// scale up to 16 bit
			bufL[i] = (chip->pan & 0x02) ? 0 : sample;
			bufR[i] = (chip->pan & 0x01) ? 0 : sample;
		}

		/* Update the parameters */
		chip->nibble_shift = nibble_shift;
	}
	else
	{
		/* Fill with 0 */
		for (i = 0; i < samples; i++)
		{
			bufL[i] = 0;
			bufR[i] = 0;
		}
	}
}